

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SilentEntitySystem *this)

{
  pointer pEVar1;
  KString *pKVar2;
  ostream *poVar3;
  pointer this_00;
  KStringStream ss;
  KString local_1e0;
  KString *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Silent Entity System:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Number Of Entities:             ",0x20);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number Of Appearance Records:   ",0x20)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_EntTyp);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->m_vEA).
            super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pEVar1) {
    do {
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_1e0,this_00,&this->m_EntTyp);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pEVar1);
  }
  pKVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString SilentEntitySystem::GetAsString() const
{
    KStringStream ss;

    ss << "Silent Entity System:\n"
       << "Number Of Entities:             " << m_ui16NumEnts               << "\n"
       << "Number Of Appearance Records:   " << m_ui16NumOfAppearanceRecords << "\n"
       << m_EntTyp.GetAsString();

    vector<EntityAppearance>::const_iterator citr = m_vEA.begin();
    vector<EntityAppearance>::const_iterator citrEnd = m_vEA.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString( m_EntTyp );
    }

    return ss.str();
}